

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

void __thiscall CSegment::Print(CSegment *this,FILE *pFile,int Mode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int Mode_local;
  FILE *pFile_local;
  CSegment *this_local;
  
  if (pFile != (FILE *)0x0) {
    if (Mode != 0) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Segment.cpp"
                    ,0xf0,"virtual void CSegment::Print(FILE *, int)");
    }
    uVar1 = CPoint::X(this->m_pPointS);
    uVar2 = CPoint::Y(this->m_pPointS);
    uVar3 = CPoint::Z(this->m_pPointS);
    uVar4 = CPoint::X(this->m_pPointE);
    iVar5 = CPoint::Y(this->m_pPointE);
    iVar6 = CPoint::Z(this->m_pPointE);
    fprintf((FILE *)pFile,"(%d,%d,%d)-(%d,%d,%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
            (ulong)uVar4,iVar5,iVar6);
    fflush((FILE *)pFile);
  }
  return;
}

Assistant:

void CSegment::Print(FILE *pFile, int Mode)
{
	if(pFile==NULL)	return;

	switch(Mode){
	case PRINT_MODE_TEXT:
		fprintf(pFile,"(%d,%d,%d)-(%d,%d,%d)\n",
			m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
			m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z());
		break;
	default:
		assert(FALSE);
		break;
	}

	fflush(pFile);
}